

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O2

void memxor16(void *vout,void *vlhs,void *vrhs)

{
  uint8_t *p;
  
  PUT_64BIT_LSB_FIRST(vout,*vrhs ^ *vlhs);
  PUT_64BIT_LSB_FIRST((void *)((long)vout + 8),
                      *(ulong *)((long)vrhs + 8) ^ *(ulong *)((long)vlhs + 8));
  return;
}

Assistant:

static inline void memxor16(void *vout, const void *vlhs, const void *vrhs)
{
    uint8_t *out = (uint8_t *)vout;
    const uint8_t *lhs = (const uint8_t *)vlhs, *rhs = (const uint8_t *)vrhs;
    uint64_t w;

    w = GET_64BIT_LSB_FIRST(lhs);
    w ^= GET_64BIT_LSB_FIRST(rhs);
    PUT_64BIT_LSB_FIRST(out, w);
    w = GET_64BIT_LSB_FIRST(lhs + 8);
    w ^= GET_64BIT_LSB_FIRST(rhs + 8);
    PUT_64BIT_LSB_FIRST(out + 8, w);
}